

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_compress_open(char *filename,int rwmode,int *hdl)

{
  memdriver *pmVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  size_t msize;
  uchar buffer [4];
  FILE *diskfile;
  undefined4 local_3c;
  FILE *local_38;
  
  if (rwmode == 0) {
    iVar4 = file_openfile(filename,0,(FILE **)&local_38);
    if (iVar4 == 0) {
      sVar5 = fread(&local_3c,1,2,local_38);
      if (sVar5 != 2) {
        fclose(local_38);
        return 0x6c;
      }
      if ((ushort)local_3c == -0x74e1) {
        bVar3 = false;
        fseek(local_38,0,2);
        uVar6 = ftell(local_38);
        fseek(local_38,-4,1);
        fread(&local_3c,1,4,local_38);
        if (uVar6 < 0x2711) {
          msize = (size_t)local_3c;
        }
        else {
          uVar9 = (ulong)(ushort)local_3c |
                  (ulong)local_3c._3_1_ << 0x18 | (ulong)local_3c._2_1_ << 0x10;
          if ((long)uVar6 <= (long)uVar9) {
            uVar6 = uVar9;
          }
          msize = uVar9 | (uVar6 - uVar9) + 0xffffffff & 0xffffffff00000000;
          bVar3 = false;
        }
      }
      else if ((ushort)local_3c == 0x4b50) {
        bVar3 = false;
        fseek(local_38,0x16,0);
        fread(&local_3c,1,4,local_38);
        msize = (size_t)local_3c;
      }
      else {
        bVar3 = true;
        if ((((ushort)local_3c != 0x1e1f) && ((ushort)local_3c != -0x62e1)) &&
           ((ushort)local_3c != -0x5fe1)) {
          fclose(local_38);
          return 1;
        }
        msize = 0;
      }
      if (msize == 0) {
        fseek(local_38,0,2);
        lVar7 = ftell(local_38);
        msize = lVar7 * 3;
      }
      fseek(local_38,0,0);
      iVar4 = mem_createmem(msize,hdl);
      if (bVar3 && iVar4 != 0) {
        iVar4 = mem_createmem(msize / 3,hdl);
      }
      if (iVar4 == 0) {
        iVar4 = mem_uncompress2mem(filename,(FILE *)local_38,*hdl);
        fclose(local_38);
        iVar2 = *hdl;
        pmVar1 = memTable + iVar2;
        if (iVar4 == 0) {
          if (*memTable[iVar2].memsizeptr <= memTable[iVar2].fitsfilesize + 0x100U) {
            return 0;
          }
          pcVar8 = (char *)realloc(*pmVar1->memaddrptr,memTable[iVar2].fitsfilesize);
          if (pcVar8 != (char *)0x0) {
            iVar4 = *hdl;
            *memTable[iVar4].memaddrptr = pcVar8;
            *memTable[iVar4].memsizeptr = memTable[iVar4].fitsfilesize;
            return 0;
          }
          ffpmsg("Failed to reduce size of allocated memory (compress_open)");
          return 0x71;
        }
        free(*pmVar1->memaddrptr);
        pmVar1->memaddrptr = (char **)0x0;
        memTable[iVar2].memaddr = (char *)0x0;
        filename = "failed to uncompress file into memory (compress_open)";
      }
      else {
        fclose(local_38);
        filename = "failed to create empty memory file (compress_open)";
      }
    }
    else {
      ffpmsg("failed to open compressed disk file (compress_open)");
    }
    ffpmsg(filename);
  }
  else {
    ffpmsg("cannot open compressed file with WRITE access (mem_compress_open)");
    ffpmsg(filename);
    iVar4 = 0x70;
  }
  return iVar4;
}

Assistant:

int mem_compress_open(char *filename, int rwmode, int *hdl)
/*
  This routine opens the compressed diskfile and creates an empty memory
  buffer with an appropriate size, then calls mem_uncompress2mem.
*/
{
    FILE *diskfile;
    int status, estimated = 1;
    unsigned char buffer[4];
    size_t finalsize, filesize;
    LONGLONG llsize = 0;
    unsigned int modulosize;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed file with WRITE access (mem_compress_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    /* open the compressed disk file */
    status = file_openfile(filename, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open compressed disk file (compress_open)");
        ffpmsg(filename);
        return(status);
    }

    if (fread(buffer, 1, 2, diskfile) != 2)  /* read 2 bytes */
    {
        fclose(diskfile);
        return(READ_ERROR);
    }

    if (memcmp(buffer, "\037\213", 2) == 0)  /* GZIP */
    {
        /* the uncompressed file size is give at the end */
        /* of the file in the ISIZE field  (modulo 2^32) */

        fseek(diskfile, 0, 2);            /* move to end of file */
        filesize = ftell(diskfile);       /* position = size of file */
        fseek(diskfile, -4L, 1);          /* move back 4 bytes */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;

/*
  the field ISIZE in the gzipped file header only stores 4 bytes and contains
  the uncompressed file size modulo 2^32.  If the uncompressed file size
  is less than the compressed file size (filesize), then one probably needs to
  add 2^32 = 4294967296 to the uncompressed file size, assuming that the gzip
  produces a compressed file that is smaller than the original file.

  But one must allow for the case of very small files, where the
  gzipped file may actually be larger then the original uncompressed file.
  Therefore, only perform the modulo 2^32 correction test if the compressed 
  file is greater than 10,000 bytes in size.  (Note: this threhold would
  fail only if the original file was greater than 2^32 bytes in size AND gzip 
  was able to compress it by more than a factor of 400,000 (!) which seems
  highly unlikely.)
  
  Also, obviously, this 2^32 modulo correction cannot be performed if the
  finalsize variable is only 32-bits long.  Typically, the 'size_t' integer
  type must be 8 bytes or larger in size to support data files that are 
  greater than 2 GB (2^31 bytes) in size.  
*/
        finalsize = modulosize;

        if (sizeof(size_t) > 4 && filesize > 10000) {
	    llsize = (LONGLONG) finalsize;  
	    /* use LONGLONG variable to suppress compiler warning */
            while (llsize <  (LONGLONG) filesize) llsize += 4294967296;

            finalsize = (size_t) llsize;
        }

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\120\113", 2) == 0)   /* PKZIP */
    {
        /* the uncompressed file size is give at byte 22 the file */

        fseek(diskfile, 22L, 0);            /* move to byte 22 */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;
        finalsize = modulosize;

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\037\036", 2) == 0)  /* PACK */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\235", 2) == 0)  /* LZW */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\240", 2) == 0)  /* LZH */
        finalsize = 0;  /* for most methods we can't determine final size */
#if HAVE_BZIP2
    else if (memcmp(buffer, "BZ", 2) == 0)        /* BZip2 */
        finalsize = 0;  /* for most methods we can't determine final size */
#endif
    else
    {
        /* not a compressed file; this should never happen */
        fclose(diskfile);
        return(1);
    }